

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

statusline checkrtspprefix(Curl_easy *data,char *s,size_t len)

{
  statusline sVar1;
  _Bool _Var2;
  statusline local_24;
  statusline onmatch;
  statusline result;
  size_t len_local;
  char *s_local;
  Curl_easy *data_local;
  
  local_24 = STATUS_BAD;
  _Var2 = checkprefixmax("RTSP/",s,len);
  sVar1 = (uint)(4 < len);
  if (!_Var2) {
    sVar1 = local_24;
  }
  local_24 = sVar1;
  return local_24;
}

Assistant:

static statusline
checkrtspprefix(struct Curl_easy *data,
                const char *s, size_t len)
{
  statusline result = STATUS_BAD;
  statusline onmatch = len >= 5? STATUS_DONE : STATUS_UNKNOWN;

#ifdef CURL_DOES_CONVERSIONS
  /* convert from the network encoding using a scratch area */
  char *scratch = strdup(s);
  if(NULL == scratch) {
    failf(data, "Failed to allocate memory for conversion!");
    return FALSE; /* can't return CURLE_OUT_OF_MEMORY so return FALSE */
  }
  if(CURLE_OK != Curl_convert_from_network(data, scratch, strlen(s) + 1)) {
    /* Curl_convert_from_network calls failf if unsuccessful */
    result = FALSE; /* can't return CURLE_foobar so return FALSE */
  }
  else if(checkprefixmax("RTSP/", scratch, len))
    result = onmatch;
  free(scratch);
#else
  (void)data; /* unused */
  if(checkprefixmax("RTSP/", s, len))
    result = onmatch;
#endif /* CURL_DOES_CONVERSIONS */

  return result;
}